

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O0

bool __thiscall ACustomInventory::TryPickup(ACustomInventory *this,AActor **toucher)

{
  FState *pFVar1;
  bool bVar2;
  FName local_2c;
  byte local_25;
  FName local_24;
  bool useok;
  FState *pFStack_20;
  FState *pickupstate;
  AActor **toucher_local;
  ACustomInventory *this_local;
  
  pickupstate = (FState *)toucher;
  toucher_local = (AActor **)this;
  FName::FName(&local_24,NAME_Pickup);
  pFStack_20 = AActor::FindState((AActor *)this,&local_24);
  local_25 = CallStateChain(this,(AActor *)pickupstate->NextState,pFStack_20);
  if (((bool)local_25) || (bVar2 = false, pFStack_20 == (FState *)0x0)) {
    FName::FName(&local_2c,NAME_Use);
    pFVar1 = AActor::FindState((AActor *)this,&local_2c);
    bVar2 = pFVar1 != (FState *)0x0;
  }
  if (bVar2) {
    local_25 = AInventory::TryPickup(&this->super_AInventory,(AActor **)pickupstate);
  }
  else if ((local_25 & 1) != 0) {
    (*(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject[0x36])();
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool ACustomInventory::TryPickup (AActor *&toucher)
{
	FState *pickupstate = FindState(NAME_Pickup);
	bool useok = CallStateChain (toucher, pickupstate);
	if ((useok || pickupstate == NULL) && FindState(NAME_Use) != NULL)
	{
		useok = Super::TryPickup (toucher);
	}
	else if (useok)
	{
		GoAwayAndDie();
	}
	return useok;
}